

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O3

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestRacingTailCaller::foo(TestRacingTailCaller *this,FooContext context)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  OwnPromiseNode node;
  void *pvVar3;
  _func_int *in_RDX;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_50;
  SourceLocation local_48;
  
  pp_Var1 = context.hook[1]._vptr_CallContextHook;
  p_Var2 = pp_Var1[1];
  if (p_Var2 == (_func_int *)0x0 || (ulong)((long)pp_Var1 - (long)p_Var2) < 0x28) {
    pvVar3 = operator_new(0x400);
    this_00 = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)(context.hook + 1),
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:982:25)>
               ::anon_class_8_1_bc11688f_for_func::operator());
    *(undefined ***)((long)pvVar3 + 0x3d8) = &PTR_destroy_006ba5f8;
    *(_func_int **)((long)pvVar3 + 0x3f8) = in_RDX;
    *(void **)((long)pvVar3 + 0x3e0) = pvVar3;
  }
  else {
    pp_Var1[1] = (_func_int *)0x0;
    this_00 = (TransformPromiseNodeBase *)(pp_Var1 + -5);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,(OwnPromiseNode *)(context.hook + 1),
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-test.c++:982:25)>
               ::anon_class_8_1_bc11688f_for_func::operator());
    pp_Var1[-5] = (_func_int *)&PTR_destroy_006ba5f8;
    pp_Var1[-1] = in_RDX;
    pp_Var1[-4] = p_Var2;
  }
  local_48.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-inl.h"
  ;
  local_48.function = "then";
  local_48.lineNumber = 0x58b;
  local_48.columnNumber = 0x4c;
  local_50.ptr = &this_00->super_PromiseNode;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)this,&local_50,&local_48);
  node.ptr = local_50.ptr;
  if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
    local_50.ptr = (PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> foo(FooContext context) override {
    return unblock.then([context]() mutable {
      auto tailRequest = context.getParams().getCallee().fooRequest();
      return context.tailCall(kj::mv(tailRequest));
    });
  }